

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

bool __thiscall Jinx::Variant::GetBoolean(Variant *this)

{
  bool bVar1;
  undefined1 uVar2;
  Variant v;
  
  if (this->m_type == Boolean) {
    uVar2 = (this->field_1).m_boolean;
  }
  else {
    Copy(&v,this);
    bVar1 = ConvertTo(&v,Boolean);
    if (bVar1) {
      uVar2 = GetBoolean(&v);
    }
    else {
      uVar2 = false;
    }
    Destroy(&v);
  }
  return (bool)uVar2;
}

Assistant:

inline bool Variant::GetBoolean() const
	{
		if (IsBoolean())
			return m_boolean;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Boolean))
			return false;
		return v.GetBoolean();
	}